

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

SSTableData * __thiscall SSTable::getAllData(SSTable *this)

{
  SSTableHeader *pSVar1;
  SSTableData *pSVar2;
  ulong uVar3;
  undefined1 local_278 [32];
  _Alloc_hider local_258;
  size_type sStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  ifstream in;
  
  pSVar2 = this->data;
  if ((pSVar2 == (SSTableData *)0x0) ||
     ((pSVar2->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pSVar2->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    pSVar1 = getHeader(this);
    create_binary_ifstream((path *)&in);
    std::istream::seekg((path *)&in,0x20,0);
    pSVar2 = (SSTableData *)operator_new(0x18);
    (pSVar2->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->data = pSVar2;
    local_258._M_p = (pointer)&local_248;
    sStack_250 = 0;
    local_248._8_8_ = 0;
    local_278._16_8_ = 0;
    local_278._24_8_ = 0;
    local_278._0_8_ = 0;
    local_278._8_8_ = 0;
    local_248._M_allocated_capacity = 0;
    while( true ) {
      uVar3 = std::istream::tellg();
      if (pSVar1->index_offset <= uVar3) break;
      operator>>((istream *)&in,(SSTableDataEntry *)local_278);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::
      emplace_back<SSTableDataEntry>(this->data,(SSTableDataEntry *)local_278);
    }
    std::__cxx11::string::~string((string *)&local_258);
    std::ifstream::~ifstream(&in);
    pSVar2 = this->data;
  }
  return pSVar2;
}

Assistant:

SSTableData *SSTable::getAllData() {
    if (data == nullptr || data->empty()) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(32); // Header always consume 32 bytes.
        data = new SSTableData{};
        auto temp = SSTableDataEntry{};
        while (in.tellg() < h->index_offset) {
            in >> temp;
            data->push_back(std::move(temp));
        }
    }
    return data;
}